

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O3

void libithicap_getopt(int *argc,char ***argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  DnsStats *pDVar4;
  logerr_t *plVar5;
  
  iVar3 = libithicap_nb_names_in_m4;
  do {
    libithicap_nb_names_in_m4 = iVar3;
    plVar5 = (logerr_t *)(ulong)(uint)*argc;
    iVar2 = getopt(*argc,*argv,"o:r:a:x:n:t:u:A:E:ghefT");
    pcVar1 = _optarg;
    iVar3 = libithicap_nb_names_in_m4;
    switch(iVar2) {
    case 0x61:
      libithicap_allowed = _optarg;
      break;
    case 0x62:
    case 99:
    case 100:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
switchD_00168408_caseD_62:
      libithicap_getopt_cold_5();
      goto switchD_00168408_caseD_74;
    case 0x65:
      libithicap_compute_nx_domain_cache = 1;
      break;
    case 0x66:
      libithicap_enable_filtering = 1;
      break;
    case 0x6e:
      iVar3 = atoi(_optarg);
      if (iVar3 < 1) {
        fprintf(_stderr,"Invalid number of names: %s\n",pcVar1);
        iVar3 = libithicap_nb_names_in_m4;
      }
      break;
    case 0x6f:
      libithicap_out_file = _optarg;
      break;
    case 0x72:
      libithicap_getopt_cold_4();
      iVar3 = libithicap_nb_names_in_m4;
      break;
    case 0x74:
      goto switchD_00168408_caseD_74;
    case 0x75:
      goto switchD_00168408_caseD_75;
    case 0x76:
      goto switchD_00168408_caseD_76;
    case 0x78:
      libithicap_banned = _optarg;
      break;
    default:
      if (iVar2 != 0x54) {
        if (iVar2 == -1) {
          return;
        }
        goto switchD_00168408_caseD_62;
      }
      libithicap_enable_tld_list = '\x01';
    }
  } while( true );
switchD_00168408_caseD_74:
  libithicap_getopt_cold_3();
switchD_00168408_caseD_75:
  libithicap_getopt_cold_2();
switchD_00168408_caseD_76:
  libithicap_getopt_cold_1();
  pDVar4 = (DnsStats *)operator_new(0x1e0);
  DnsStats::DnsStats(pDVar4);
  libithicap_stats = pDVar4;
  logerr = plVar5;
  if (libithicap_allowed != (char *)0x0) {
    AddressFilter::AddToList(&pDVar4->allowedAddresses,libithicap_allowed);
  }
  if (libithicap_banned != (char *)0x0) {
    AddressFilter::AddToList(&libithicap_stats->bannedAddresses,libithicap_banned);
  }
  pDVar4 = libithicap_stats;
  if (-1 < libithicap_nb_names_in_m4) {
    libithicap_stats->max_tld_leakage_count = libithicap_nb_names_in_m4;
  }
  pDVar4->capture_cache_ratio_nx_domain = (bool)libithicap_compute_nx_domain_cache;
  pDVar4->enable_frequent_address_filtering = (bool)libithicap_enable_filtering;
  if (libithicap_enable_tld_list == '\x01') {
    *(byte *)&pDVar4->dnsstat_flags = (byte)pDVar4->dnsstat_flags | 0x22;
  }
  return;
}

Assistant:

void libithicap_getopt(int* argc, char** argv[])
    {
        int opt;
        int exit_code = 0;

        while (exit_code == 0 && (opt = getopt(*argc, *argv, "o:r:a:x:n:t:u:A:E:ghefT")) != -1)
        {
            switch (opt)
            {
            case 'o':
                libithicap_out_file = optarg;
                break;
            case 'r':
                // root_address_file = optarg;
                fprintf(stderr, "The root addresses redefinition option is not yet implemented.\n");
                break;
            case 'a':
                libithicap_allowed = optarg;
                break;
            case 'x':
                libithicap_banned = optarg;
                break;
            case 'n':
            {
                int nb_names_in_m4;

                if ((nb_names_in_m4 = atoi(optarg)) <= 0)
                {
                    fprintf(stderr, "Invalid number of names: %s\n", optarg);
                }
                else
                {
                    libithicap_nb_names_in_m4 = (uint32_t)nb_names_in_m4;
                }
                break;
            }
            case 'e':
                libithicap_compute_nx_domain_cache = true;
                break;
            case 'f':
                libithicap_enable_filtering = true;
                break;

#ifdef PRIVACY_CONSCIOUS
            case 'A':
                libithicap_address_list = optarg;
                break;
            case 'E':
                libithicap_name_list = optarg;
                break;
            case 'g':
                libithicap_compress = true;
                break;
#endif
            case 'T':
                libithicap_enable_tld_list = true;
                break;
            case 't':
                fprintf(stderr, "Sorry, update list of registered TLD not implemented yet.\n");
                exit(1);
                break;
            case 'u':
                fprintf(stderr, "Sorry, update list of special usage names (RFC6761) not implemented yet.\n");
                exit(1);
                break;
            case 'v':
                libithicap_version();
                exit(1);
            case '?':
            case 'h':
            default:
                libithicap_usage();
                exit(1);
            }
        }
    }